

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsops.c
# Opt level: O3

LispPTR LCGetIVValue(LispPTR object,LispPTR iv)

{
  undefined4 *puVar1;
  ulong uVar2;
  DLword *pDVar3;
  LispPTR LVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int i;
  uint uVar8;
  
  uVar2 = (ulong)object;
  if (atom_instance == 0) {
    LCinit();
  }
  uVar5 = *(ushort *)((ulong)(object >> 8 & 0xfffffe) + (long)MDStypetbl ^ 2) & 0x7ff;
  if ((*(uint *)((long)DTDspace + (ulong)uVar5 * 4 + (ulong)(uVar5 << 5)) & 0xfffffff) ==
      atom_instance) {
    if ((object & 1) != 0) {
      printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",uVar2);
    }
    pDVar3 = Lisp_world;
    uVar5 = *(uint *)(Lisp_world + uVar2 + 2);
    uVar7 = (ulong)(((uVar5 ^ iv) & 0x3ff) << 4);
    puVar1 = (undefined4 *)((long)&LCIVCache->iNames + uVar7);
    if ((*(uint *)((long)&LCIVCache->iNames + uVar7) == uVar5) && (puVar1[1] == iv)) {
      uVar8 = (uint)*(ushort *)(puVar1 + 2);
LAB_0012d443:
      uVar5 = *(uint *)(pDVar3 + uVar2 + 4);
      if ((uVar5 & 1) != 0) {
        printf("Misaligned pointer in NativeAligned4FromLAddr 0x%x\n",(ulong)uVar5);
      }
      uVar6 = *(ushort *)
               ((ulong)(*(uint *)(Lisp_world + (ulong)uVar5 + (ulong)uVar8 * 2) >> 8 & 0xfffffffe) +
                (long)MDStypetbl ^ 2) & 0x7ff;
      if ((*(uint *)((long)DTDspace + (ulong)uVar6 * 4 + (ulong)(uVar6 << 5)) & 0xfffffff) !=
          atom_annotatedValue) {
        return *(uint *)(Lisp_world + (ulong)uVar5 + (ulong)uVar8 * 2);
      }
    }
    else if ((*(ushort *)((ulong)(uVar5 >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) & 0x7ff) == 5) {
      uVar8 = 0;
      do {
        LVar4 = car(uVar5);
        if (LVar4 == iv) {
          *puVar1 = *(undefined4 *)(pDVar3 + uVar2 + 2);
          puVar1[1] = iv;
          puVar1[2] = uVar8 | 0xe0000;
          goto LAB_0012d443;
        }
        uVar8 = uVar8 + 1;
        uVar5 = cdr(uVar5);
      } while (uVar5 != 0);
    }
  }
  lcfuncall(atom_GetIVValue_LCUFN,2,3);
  return 0xfffffffe;
}

Assistant:

LispPTR LCGetIVValue(LispPTR object, LispPTR iv) {
  struct LCInstance *objptr;
  LispPTR val;
  int index;

  LC_INIT;
  INSTANCE_OR_PUNT(object, atom_GetIVValue_LCUFN, 2);

  objptr = (struct LCInstance *)NativeAligned4FromLAddr(object);
  GET_IV_INDEX(objptr, iv, index, goto pnut);
  val = ((LispPTR *)NativeAligned4FromLAddr(objptr->iDescrs))[index];
  if (!LC_TYPEP(val, atom_annotatedValue)) return val;
pnut:
  RETCALL(atom_GetIVValue_LCUFN, 2);
  /*
    return LCGetActiveValue(object,val);
  */
}